

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

void __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::application_requested
          (_legacy_pool_policy *this,service *srv)

{
  size_t sVar1;
  ulong uVar2;
  application *paVar3;
  
  if ((this->total_ < this->limit_) &&
     (uVar2 = this->pending_ + 1, this->pending_ = uVar2, this->size_ < uVar2)) {
    paVar3 = _policy::get_new(&this->super__policy,srv);
    sVar1 = this->size_;
    (this->apps_).super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
    _M_impl.super__Vector_impl_data._M_start[sVar1] = paVar3;
    this->size_ = sVar1 + 1;
    this->total_ = this->total_ + 1;
  }
  return;
}

Assistant:

virtual void application_requested(cppcms::service &srv) 
	{
		if(total_ >= limit_)
			return;
		pending_++;
		if(pending_ > size_) {
			apps_[size_] = get_new(srv);
			size_++;
			total_++;
		}
	}